

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O3

void __thiscall leveldb::MemEnvTest_Basics_Test::TestBody(MemEnvTest_Basics_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Env *pEVar2;
  void *pvVar3;
  size_type sVar4;
  int iVar5;
  undefined8 *puVar6;
  AssertHelper *pAVar7;
  string *this_00;
  _Alloc_hider _Var8;
  char *pcVar9;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_01;
  bool bVar10;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  SequentialFile *seq_file;
  RandomAccessFile *rand_file;
  uint64_t file_size;
  WritableFile *writable_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  children;
  string local_c0;
  string local_a0;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar2 = (this->super_MemEnvTest).env_;
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir","");
  (*pEVar2->_vptr_Env[10])(local_80,pEVar2,&local_a0);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
             (char *)&local_60,(Status *)"env_->CreateDir(\"/dir\")");
  if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
    operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_c0._M_string_length;
    }
    iVar5 = 0x1f;
LAB_0010bf43:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,iVar5,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    _Var8._M_p = local_a0._M_dataplus._M_p;
LAB_0010bfdf:
    puVar6 = (undefined8 *)local_c0._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_Var8._M_p + 8))();
      puVar6 = (undefined8 *)local_c0._M_string_length;
    }
  }
  else {
    if ((undefined8 *)local_c0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_c0._M_string_length !=
          (undefined8 *)(local_c0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_c0._M_string_length);
      }
      operator_delete((void *)local_c0._M_string_length);
    }
    pEVar2 = (this->super_MemEnvTest).env_;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/non_existent","");
    iVar5 = (*pEVar2->_vptr_Env[6])(pEVar2,&local_a0);
    local_c0._M_dataplus._M_p = (pointer)(CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)iVar5) ^ 1)
    ;
    local_c0._M_string_length = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((char)iVar5 != '\0') {
      testing::Message::Message((Message *)local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,(internal *)&local_c0,
                 (AssertionResult *)"!env_->FileExists(\"/dir/non_existent\")","false","true",in_R9)
      ;
      this_01 = &local_60;
      iVar5 = 0x22;
LAB_0010bfb5:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,iVar5,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      _Var8._M_p = (pointer)CONCAT44(local_80._4_4_,local_80._0_4_);
      goto LAB_0010bfdf;
    }
    pEVar2 = (this->super_MemEnvTest).env_;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/non_existent","");
    (*pEVar2->_vptr_Env[0xd])(local_80,pEVar2,&local_a0,&local_60);
    pvVar3 = (void *)CONCAT44(local_80._4_4_,local_80._0_4_);
    local_c0._M_dataplus._M_p._0_1_ = pvVar3 != (void *)0x0;
    local_c0._M_string_length = 0;
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (pvVar3 == (void *)0x0) {
      testing::Message::Message((Message *)local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,(internal *)&local_c0,
                 (AssertionResult *)"!env_->GetFileSize(\"/dir/non_existent\", &file_size).ok()",
                 "false","true",in_R9);
      this_01 = &local_58;
      iVar5 = 0x23;
      goto LAB_0010bfb5;
    }
    pEVar2 = (this->super_MemEnvTest).env_;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir","");
    (*pEVar2->_vptr_Env[7])(local_80,pEVar2,&local_a0,&local_48);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
               (char *)&local_58,(Status *)"env_->GetChildren(\"/dir\", &children)");
    if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
      operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    sVar4 = local_c0._M_string_length;
    if ((char)local_c0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)local_c0._M_string_length;
      }
      iVar5 = 0x24;
      goto LAB_0010bf43;
    }
    if ((undefined8 *)local_c0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_c0._M_string_length !=
          (undefined8 *)(local_c0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_c0._M_string_length);
      }
      operator_delete((void *)sVar4);
    }
    local_80._0_4_ = 0;
    local_c0._M_dataplus._M_p =
         (pointer)((long)local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_a0,"0","children.size()",(int *)local_80,
               (unsigned_long *)&local_c0);
    sVar4 = local_a0._M_string_length;
    if ((char)local_a0._M_dataplus._M_p != '\0') {
      if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_a0._M_string_length !=
            (undefined8 *)(local_a0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_a0._M_string_length);
        }
        operator_delete((void *)sVar4);
      }
      pEVar2 = (this->super_MemEnvTest).env_;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
      (*pEVar2->_vptr_Env[4])(local_80,pEVar2,&local_a0,&local_58);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70,
                 (Status *)"env_->NewWritableFile(\"/dir/f\", &writable_file)");
      if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
        operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((char)local_c0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = *(char **)local_c0._M_string_length;
        }
        pAVar7 = (AssertHelper *)local_80;
        iVar5 = 0x28;
LAB_0010c16c:
        testing::internal::AssertHelper::AssertHelper
                  (pAVar7,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,iVar5,pcVar9);
        testing::internal::AssertHelper::operator=(pAVar7,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(pAVar7);
        local_70._0_8_ = local_a0._M_dataplus._M_p;
LAB_0010c18c:
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_70._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(size_type *)local_70._0_8_ + 8))();
        }
LAB_0010c197:
        this_00 = &local_c0;
      }
      else {
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
        pEVar2 = (this->super_MemEnvTest).env_;
        local_a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
        (*pEVar2->_vptr_Env[0xd])(local_80,pEVar2,&local_a0,&local_60);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70,
                   (Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
        if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((char)local_c0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_a0);
          if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)local_c0._M_string_length;
          }
          pAVar7 = (AssertHelper *)local_80;
          iVar5 = 0x29;
          goto LAB_0010c16c;
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
        local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_a0,"0","file_size",(int *)&local_c0,(unsigned_long *)&local_60
                  );
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c0);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)local_a0._M_string_length;
          }
          pAVar7 = (AssertHelper *)local_80;
          iVar5 = 0x2a;
          goto LAB_0010c24d;
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
        if (local_58._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(((local_58._M_head_impl)->_M_dataplus)._M_p + 8))();
        }
        pEVar2 = (this->super_MemEnvTest).env_;
        local_a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
        iVar5 = (*pEVar2->_vptr_Env[6])(pEVar2,&local_a0);
        local_c0._M_dataplus._M_p._0_1_ = (char)iVar5;
        local_c0._M_string_length = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == paVar1) {
          if ((char)iVar5 != '\0') goto LAB_0010b5ae;
LAB_0010c1ae:
          testing::Message::Message((Message *)local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a0,(internal *)&local_c0,(AssertionResult *)0x1572f3,"false","true",
                     in_R9);
          iVar5 = 0x2e;
LAB_0010c1fe:
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                     ,iVar5,local_a0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)local_80);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          local_70._0_8_ = CONCAT44(local_80._4_4_,local_80._0_4_);
          goto LAB_0010c18c;
        }
        operator_delete(local_a0._M_dataplus._M_p);
        if (((ulong)local_c0._M_dataplus._M_p & 1) == 0) goto LAB_0010c1ae;
LAB_0010b5ae:
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
        pEVar2 = (this->super_MemEnvTest).env_;
        local_a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
        (*pEVar2->_vptr_Env[0xd])(local_80,pEVar2,&local_a0,&local_60);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70,
                   (Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
        if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((char)local_c0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_a0);
          if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)local_c0._M_string_length;
          }
          pAVar7 = (AssertHelper *)local_80;
          iVar5 = 0x2f;
          goto LAB_0010c16c;
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
        local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_a0,"0","file_size",(int *)&local_c0,(unsigned_long *)&local_60
                  );
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c0);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)local_a0._M_string_length;
          }
          pAVar7 = (AssertHelper *)local_80;
          iVar5 = 0x30;
          goto LAB_0010c24d;
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
        pEVar2 = (this->super_MemEnvTest).env_;
        local_a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir","");
        (*pEVar2->_vptr_Env[7])(local_80,pEVar2,&local_a0,&local_48);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70,
                   (Status *)"env_->GetChildren(\"/dir\", &children)");
        if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((char)local_c0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_a0);
          if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)local_c0._M_string_length;
          }
          pAVar7 = (AssertHelper *)local_80;
          iVar5 = 0x31;
          goto LAB_0010c16c;
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
        local_80._0_4_ = 1;
        local_c0._M_dataplus._M_p =
             (pointer)((long)local_48.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_a0,"1","children.size()",(int *)local_80,
                   (unsigned_long *)&local_c0);
        if ((char)local_a0._M_dataplus._M_p != '\0') {
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
          testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
                    ((internal *)&local_a0,"\"f\"","children[0]",(char (*) [2])0x1571d2,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c0);
            if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_a0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x33;
            goto LAB_0010c24d;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
          (*pEVar2->_vptr_Env[4])(local_80,pEVar2,&local_a0,&local_58);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70
                     ,(Status *)"env_->NewWritableFile(\"/dir/f\", &writable_file)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_a0);
            if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_c0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x36;
            goto LAB_0010c16c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          local_c0._M_dataplus._M_p = "abc";
          local_c0._M_string_length = 3;
          (**(code **)(((local_58._M_head_impl)->_M_dataplus)._M_p + 0x10))
                    (local_80,local_58._M_head_impl,&local_c0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_a0,local_70
                     ,(Status *)"writable_file->Append(\"abc\")");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c0);
            if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_a0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x37;
            goto LAB_0010c24d;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
          if (local_58._M_head_impl !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(((local_58._M_head_impl)->_M_dataplus)._M_p + 8))();
          }
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
          (*pEVar2->_vptr_Env[5])(local_80,pEVar2,&local_a0,&local_58);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70
                     ,(Status *)"env_->NewAppendableFile(\"/dir/f\", &writable_file)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_a0);
            if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_c0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x3b;
            goto LAB_0010c16c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
          (*pEVar2->_vptr_Env[0xd])(local_80,pEVar2,&local_a0,&local_60);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70
                     ,(Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_a0);
            if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_c0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x3c;
            goto LAB_0010c16c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          local_c0._M_dataplus._M_p._0_4_ = 3;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&local_a0,"3","file_size",(int *)&local_c0,
                     (unsigned_long *)&local_60);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c0);
            if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_a0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x3d;
            goto LAB_0010c24d;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
          local_c0._M_dataplus._M_p = "hello";
          local_c0._M_string_length = 5;
          (**(code **)(((local_58._M_head_impl)->_M_dataplus)._M_p + 0x10))(local_80);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_a0,local_70
                     ,(Status *)"writable_file->Append(\"hello\")");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c0);
            if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_a0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x3e;
            goto LAB_0010c24d;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
          if (local_58._M_head_impl !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(((local_58._M_head_impl)->_M_dataplus)._M_p + 8))();
          }
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
          (*pEVar2->_vptr_Env[0xd])(local_80,pEVar2,&local_a0,&local_60);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70
                     ,(Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_a0);
            if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_c0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x42;
            goto LAB_0010c16c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          local_c0._M_dataplus._M_p._0_4_ = 8;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&local_a0,"8","file_size",(int *)&local_c0,
                     (unsigned_long *)&local_60);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c0);
            if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_a0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x43;
            goto LAB_0010c24d;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"/dir/non_existent","");
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/dir/g","");
          (*pEVar2->_vptr_Env[0xe])(local_70,pEVar2,&local_a0,&local_c0);
          local_80[0] = (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)
                        ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70._0_8_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0);
          local_80._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_70._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__((void *)local_70._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if (local_80[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
            testing::Message::Message((Message *)&local_c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,(internal *)local_80,
                       (AssertionResult *)
                       "!env_->RenameFile(\"/dir/non_existent\", \"/dir/g\").ok()","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,0x46,local_a0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_70,(Message *)&local_c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
            _Var8._M_p = local_c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._M_dataplus._M_p);
              _Var8._M_p = local_c0._M_dataplus._M_p;
            }
LAB_0010c6e4:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var8._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)_Var8._M_p + 8))();
            }
            this_00 = (string *)local_80;
            goto LAB_0010c19c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/dir/g","");
          (*pEVar2->_vptr_Env[0xe])(local_70,pEVar2,&local_a0,&local_c0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_80,
                     local_70 + 8,(Status *)"env_->RenameFile(\"/dir/f\", \"/dir/g\")");
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_70._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__((void *)local_70._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if (local_80[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
            testing::Message::Message((Message *)&local_a0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = ((_Alloc_hider *)local_80._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,0x47,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_c0,(Message *)&local_a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
            _Var8._M_p = local_a0._M_dataplus._M_p;
            goto LAB_0010c6e4;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/f","");
          iVar5 = (*pEVar2->_vptr_Env[6])(pEVar2,&local_a0);
          local_c0._M_dataplus._M_p =
               (pointer)(CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)iVar5) ^ 1);
          local_c0._M_string_length = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p == paVar1) {
            if ((char)iVar5 != '\0') goto LAB_0010c64f;
          }
          else {
            operator_delete(local_a0._M_dataplus._M_p);
            if (((ulong)local_c0._M_dataplus._M_p & 1) == 0) {
LAB_0010c64f:
              testing::Message::Message((Message *)local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_a0,(internal *)&local_c0,
                         (AssertionResult *)"!env_->FileExists(\"/dir/f\")","false","true",in_R9);
              iVar5 = 0x48;
              goto LAB_0010c1fe;
            }
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/g","");
          iVar5 = (*pEVar2->_vptr_Env[6])(pEVar2,&local_a0);
          local_c0._M_dataplus._M_p._0_1_ = (char)iVar5;
          local_c0._M_string_length = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p == paVar1) {
            if ((char)iVar5 == '\0') goto LAB_0010c701;
          }
          else {
            operator_delete(local_a0._M_dataplus._M_p);
            if (((ulong)local_c0._M_dataplus._M_p & 1) == 0) {
LAB_0010c701:
              testing::Message::Message((Message *)local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_a0,(internal *)&local_c0,(AssertionResult *)0x157412,"false","true",
                         in_R9);
              iVar5 = 0x49;
              goto LAB_0010c1fe;
            }
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/g","");
          (*pEVar2->_vptr_Env[0xd])(local_80,pEVar2,&local_a0,&local_60);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_70
                     ,(Status *)"env_->GetFileSize(\"/dir/g\", &file_size)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_a0);
            if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_c0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x4a;
            goto LAB_0010c16c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          local_c0._M_dataplus._M_p._0_4_ = 8;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&local_a0,"8","file_size",(int *)&local_c0,
                     (unsigned_long *)&local_60);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c0);
            if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_a0._M_string_length;
            }
            pAVar7 = (AssertHelper *)local_80;
            iVar5 = 0x4b;
            goto LAB_0010c24d;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"/dir/non_existent","");
          (*pEVar2->_vptr_Env[2])(local_70,pEVar2,&local_a0,local_80);
          local_c0._M_dataplus._M_p._0_1_ =
               (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )local_70._0_8_ !=
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_c0._M_string_length = 0;
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_70._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__((void *)local_70._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,(internal *)&local_c0,
                       (AssertionResult *)
                       "!env_->NewSequentialFile(\"/dir/non_existent\", &seq_file).ok()","false",
                       "true",in_R9);
            iVar5 = 0x50;
LAB_0010c804:
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)(local_70 + 8),kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,iVar5,local_a0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)(local_70 + 8),(Message *)local_70);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_70 + 8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            goto LAB_0010c18c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          bVar10 = CONCAT44(local_80._4_4_,local_80._0_4_) == 0;
          local_c0._M_dataplus._M_p._0_1_ = bVar10;
          local_c0._M_string_length = 0;
          if (!bVar10) {
            testing::Message::Message((Message *)local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,(internal *)&local_c0,(AssertionResult *)"!seq_file","false","true"
                       ,in_R9);
            iVar5 = 0x51;
            goto LAB_0010c804;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"/dir/non_existent","");
          (*pEVar2->_vptr_Env[3])(local_70 + 8,pEVar2,&local_a0,local_70);
          pvVar3 = (void *)CONCAT44(local_70._12_4_,local_70._8_4_);
          local_c0._M_dataplus._M_p._0_1_ = pvVar3 != (void *)0x0;
          local_c0._M_string_length = 0;
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)(local_70 + 8));
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,(internal *)&local_c0,
                       (AssertionResult *)
                       "!env_->NewRandomAccessFile(\"/dir/non_existent\", &rand_file).ok()","false",
                       "true",in_R9);
            iVar5 = 0x52;
LAB_0010c998:
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,iVar5,local_a0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)(local_70 + 8));
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            local_70._0_8_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_70._12_4_,local_70._8_4_);
            goto LAB_0010c18c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          local_c0._M_dataplus._M_p._0_1_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_70._0_8_ ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_c0._M_string_length = 0;
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_70._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            testing::Message::Message((Message *)(local_70 + 8));
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,(internal *)&local_c0,(AssertionResult *)"!rand_file","false",
                       "true",in_R9);
            iVar5 = 0x53;
            goto LAB_0010c998;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"/dir/non_existent","");
          (*pEVar2->_vptr_Env[8])(local_70 + 8,pEVar2,&local_a0);
          pvVar3 = (void *)CONCAT44(local_70._12_4_,local_70._8_4_);
          local_c0._M_dataplus._M_p._0_1_ = pvVar3 != (void *)0x0;
          local_c0._M_string_length = 0;
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)(local_70 + 8));
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,(internal *)&local_c0,
                       (AssertionResult *)"!env_->RemoveFile(\"/dir/non_existent\").ok()","false",
                       "true",in_R9);
            iVar5 = 0x56;
            goto LAB_0010c998;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/g","");
          (*pEVar2->_vptr_Env[8])(local_70 + 8,pEVar2,&local_a0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_50,(Status *)"env_->RemoveFile(\"/dir/g\")");
          if ((void *)CONCAT44(local_70._12_4_,local_70._8_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_70._12_4_,local_70._8_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_a0);
            if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_c0._M_string_length;
            }
            pAVar7 = (AssertHelper *)(local_70 + 8);
            iVar5 = 0x57;
            goto LAB_0010c16c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir/g","");
          iVar5 = (*pEVar2->_vptr_Env[6])(pEVar2,&local_a0);
          local_c0._M_dataplus._M_p =
               (pointer)(CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)iVar5) ^ 1);
          local_c0._M_string_length = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p == paVar1) {
            if ((char)iVar5 != '\0') goto LAB_0010cd24;
          }
          else {
            operator_delete(local_a0._M_dataplus._M_p);
            if (((ulong)local_c0._M_dataplus._M_p & 1) == 0) {
LAB_0010cd24:
              testing::Message::Message((Message *)(local_70 + 8));
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_a0,(internal *)&local_c0,
                         (AssertionResult *)"!env_->FileExists(\"/dir/g\")","false","true",in_R9);
              iVar5 = 0x58;
              goto LAB_0010c998;
            }
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir","");
          (*pEVar2->_vptr_Env[7])(local_70 + 8,pEVar2,&local_a0,&local_48);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_50,(Status *)"env_->GetChildren(\"/dir\", &children)");
          if ((void *)CONCAT44(local_70._12_4_,local_70._8_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_70._12_4_,local_70._8_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_a0);
            if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_c0._M_string_length;
            }
            pAVar7 = (AssertHelper *)(local_70 + 8);
            iVar5 = 0x59;
            goto LAB_0010c16c;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_c0);
          local_70._8_4_ = 0;
          local_c0._M_dataplus._M_p =
               (pointer)((long)local_48.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_48.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&local_a0,"0","children.size()",(int *)(local_70 + 8),
                     (unsigned_long *)&local_c0);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c0);
            if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_a0._M_string_length;
            }
            pAVar7 = (AssertHelper *)(local_70 + 8);
            iVar5 = 0x5a;
            goto LAB_0010c24d;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_a0);
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/dir","");
          (*pEVar2->_vptr_Env[0xb])(local_70 + 8,pEVar2,&local_a0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_50,(Status *)"env_->RemoveDir(\"/dir\")");
          if ((void *)CONCAT44(local_70._12_4_,local_70._8_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_70._12_4_,local_70._8_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if ((char)local_c0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_a0);
            if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_c0._M_string_length;
            }
            pAVar7 = (AssertHelper *)(local_70 + 8);
            iVar5 = 0x5b;
            goto LAB_0010c16c;
          }
          goto LAB_0010c197;
        }
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = *(char **)local_a0._M_string_length;
        }
        pAVar7 = (AssertHelper *)local_80;
        iVar5 = 0x32;
LAB_0010c24d:
        testing::internal::AssertHelper::AssertHelper
                  (pAVar7,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,iVar5,pcVar9);
        testing::internal::AssertHelper::operator=(pAVar7,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(pAVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_c0._M_dataplus._M_p + 8))();
        }
        this_00 = &local_a0;
      }
LAB_0010c19c:
      testing::AssertionResult::~AssertionResult((AssertionResult *)this_00);
      goto LAB_0010c00d;
    }
    testing::Message::Message((Message *)&local_c0);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,0x25,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    puVar6 = (undefined8 *)local_a0._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_c0._M_dataplus._M_p + 8))();
      puVar6 = (undefined8 *)local_a0._M_string_length;
    }
  }
  if (puVar6 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar6 != puVar6 + 2) {
      operator_delete((undefined8 *)*puVar6);
    }
    operator_delete(puVar6);
  }
LAB_0010c00d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

TEST_F(MemEnvTest, Basics) {
  uint64_t file_size;
  WritableFile* writable_file;
  std::vector<std::string> children;

  ASSERT_LEVELDB_OK(env_->CreateDir("/dir"));

  // Check that the directory is empty.
  ASSERT_TRUE(!env_->FileExists("/dir/non_existent"));
  ASSERT_TRUE(!env_->GetFileSize("/dir/non_existent", &file_size).ok());
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(0, children.size());

  // Create a file.
  ASSERT_LEVELDB_OK(env_->NewWritableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(0, file_size);
  delete writable_file;

  // Check that the file exists.
  ASSERT_TRUE(env_->FileExists("/dir/f"));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(0, file_size);
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(1, children.size());
  ASSERT_EQ("f", children[0]);

  // Write to the file.
  ASSERT_LEVELDB_OK(env_->NewWritableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(writable_file->Append("abc"));
  delete writable_file;

  // Check that append works.
  ASSERT_LEVELDB_OK(env_->NewAppendableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(3, file_size);
  ASSERT_LEVELDB_OK(writable_file->Append("hello"));
  delete writable_file;

  // Check for expected size.
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(8, file_size);

  // Check that renaming works.
  ASSERT_TRUE(!env_->RenameFile("/dir/non_existent", "/dir/g").ok());
  ASSERT_LEVELDB_OK(env_->RenameFile("/dir/f", "/dir/g"));
  ASSERT_TRUE(!env_->FileExists("/dir/f"));
  ASSERT_TRUE(env_->FileExists("/dir/g"));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/g", &file_size));
  ASSERT_EQ(8, file_size);

  // Check that opening non-existent file fails.
  SequentialFile* seq_file;
  RandomAccessFile* rand_file;
  ASSERT_TRUE(!env_->NewSequentialFile("/dir/non_existent", &seq_file).ok());
  ASSERT_TRUE(!seq_file);
  ASSERT_TRUE(!env_->NewRandomAccessFile("/dir/non_existent", &rand_file).ok());
  ASSERT_TRUE(!rand_file);

  // Check that deleting works.
  ASSERT_TRUE(!env_->RemoveFile("/dir/non_existent").ok());
  ASSERT_LEVELDB_OK(env_->RemoveFile("/dir/g"));
  ASSERT_TRUE(!env_->FileExists("/dir/g"));
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(0, children.size());
  ASSERT_LEVELDB_OK(env_->RemoveDir("/dir"));
}